

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_createJsonString(csafestring_t *buffer,map2json_tree_t *tree)

{
  csafestring_t *in_RSI;
  map2json_tree_t *in_RDI;
  csafestring_t *unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  
  if (in_RSI != (csafestring_t *)0x0) {
    if (in_RSI->data != (char *)0x0) {
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      safe_strcat(unaff_retaddr,(char *)in_RDI);
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
    }
    if (*(int *)&in_RSI[2].data == 1) {
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      map2json_createJsonString
                (in_RSI,(map2json_tree_t *)
                        CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
    }
    if (*(int *)&in_RSI[2].data == 2) {
      map2json_createJsonStringArray(unaff_retaddr,in_RDI);
    }
    if ((*(int *)&in_RSI[2].data == 4) || (*(int *)&in_RSI[2].data == 3)) {
      if (*(int *)&in_RSI[2].data == 3) {
        safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      }
      safe_strcat(unaff_retaddr,(char *)in_RDI);
      if (*(int *)&in_RSI[2].data == 3) {
        safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      }
    }
    if (in_RSI[2].buffer_length != 0) {
      safe_strchrappend(in_RSI,in_stack_ffffffffffffffef);
      map2json_createJsonString
                (in_RSI,(map2json_tree_t *)
                        CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    }
  }
  return;
}

Assistant:

static void map2json_createJsonString(csafestring_t *buffer, map2json_tree_t *tree) {
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... ", buffer->data);

	if ( tree == NULL ) {
		DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
		return;
	}

	if ( tree->key != NULL ) {
		safe_strchrappend(buffer, '\"');
		safe_strcat(buffer, tree->key);
		safe_strchrappend(buffer, '\"');
		safe_strchrappend(buffer, ':');
	}

	if ( tree->type == JSMN_OBJECT ) {
		safe_strchrappend(buffer, '{');
		map2json_createJsonString(buffer, tree->children);
		safe_strchrappend(buffer, '}');
	}

	if ( tree->type == JSMN_ARRAY ) {
		map2json_createJsonStringArray(buffer, tree);
	}

	if ( tree->type == JSMN_PRIMITIVE || tree->type == JSMN_STRING ) {
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
		safe_strcat(buffer, tree->value);
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
	}

	if ( tree->next != NULL ) {
		safe_strchrappend(buffer, ',');
		map2json_createJsonString(buffer, tree->next);
	}
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
}